

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileExpr(jx9_gen_state *pGen,sxi32 iFlags,
                    _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xTreeValidator)

{
  int iVar1;
  uint uVar2;
  SyToken *pSVar3;
  jx9_expr_node *pjVar4;
  ProcNodeConstruct p_Var5;
  byte bVar6;
  sxi32 sVar7;
  jx9_expr_node **apNode;
  undefined8 *pChunk;
  jx9_expr_op *pjVar8;
  ulong uVar9;
  SyToken *pCur;
  code *pcVar10;
  SyToken *pSVar11;
  char *pcVar12;
  sxu32 sVar13;
  uint uVar14;
  sxi32 *psVar15;
  long lVar16;
  SyToken *pSVar17;
  SyToken *pCur_2;
  int iVar18;
  int iVar19;
  SyToken *pCur_3;
  SyToken *pSVar20;
  jx9_vm *pjVar21;
  ulong uVar22;
  int iVar23;
  SyToken *pSVar24;
  SySet local_68;
  SyToken *local_40;
  undefined8 *local_38;
  
  pjVar21 = pGen->pVm;
  local_68.nSize = 0;
  local_68.eSize = 8;
  local_68.pUserData = (void *)0x0;
  local_68.pAllocator = &pjVar21->sAllocator;
  apNode = (jx9_expr_node **)SyMemBackendAlloc(&pjVar21->sAllocator,0x80);
  if (apNode != (jx9_expr_node **)0x0) {
    local_68.nSize = 0x10;
  }
  pSVar17 = pGen->pIn;
  pSVar20 = pGen->pEnd;
  local_68.pBase = apNode;
  if (pSVar17 < pSVar20) {
    iVar18 = 0;
    pSVar24 = pSVar17;
    do {
      uVar14 = pSVar24->nType;
      if ((uVar14 & 0x40) == 0) {
        if ((char)uVar14 < '\0') {
          iVar18 = iVar18 + -1;
        }
        else if (((uVar14 >> 0x12 & 1) != 0) && (iVar18 < 1)) break;
      }
      else {
        iVar18 = iVar18 + 1;
      }
      pSVar24 = pSVar24 + 1;
    } while (pSVar24 < pSVar20);
    if (pSVar17 < pSVar24) {
      pGen->pEnd = pSVar24;
      local_68.nUsed = 0;
      local_68.nCursor = 0;
      local_38 = (undefined8 *)0x0;
      local_40 = pSVar20;
      do {
        pChunk = (undefined8 *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x68);
        if (pChunk == (undefined8 *)0x0) {
          uVar14 = 0xffffffff;
          goto LAB_00125574;
        }
        pChunk[10] = 0;
        pChunk[0xb] = 0;
        pChunk[8] = 0;
        pChunk[9] = 0;
        pChunk[6] = 0;
        pChunk[7] = 0;
        pChunk[4] = 0;
        pChunk[5] = 0;
        pChunk[2] = 0;
        pChunk[3] = 0;
        *pChunk = 0;
        pChunk[1] = 0;
        pChunk[0xc] = 0;
        pjVar21 = pGen->pVm;
        *(undefined4 *)(pChunk + 10) = 8;
        pChunk[7] = pjVar21;
        pSVar17 = pGen->pIn;
        pChunk[3] = pSVar17;
        uVar14 = pSVar17->nType;
        if ((uVar14 & 0x20) != 0) {
          *pChunk = pSVar17->pUserData;
          goto LAB_00124fa4;
        }
        if ((uVar14 & 0x10) == 0) {
          if ((uVar14 & 0x40) == 0) {
            if ((uVar14 >> 0xb & 1) == 0) {
              if ((uVar14 & 4) == 0) {
                if ((uVar14 & 8) != 0) goto LAB_001251b1;
                if ((uVar14 & 0x121680) == 0) {
                  pcVar10 = jx9CompileNumLiteral;
                  if (((((uVar14 & 3) == 0) &&
                       (pcVar10 = jx9CompileString, (uVar14 >> 0xd & 1) == 0)) &&
                      (pcVar10 = jx9CompileSimpleString, (uVar14 >> 0xe & 1) == 0)) &&
                     (pcVar10 = jx9CompileNowdoc, (uVar14 >> 0x10 & 1) == 0)) {
                    pChunk[6] = 0;
                    iVar18 = jx9GenCompileError(pGen,1,pSVar17->nLine,
                                                "Syntax error: Unexpected token \'%z\'");
LAB_00125503:
                    uVar14 = (uint)(iVar18 == -10) * 2 | 0xfffffff4;
                    goto LAB_00125511;
                  }
                  pChunk[6] = pcVar10;
                }
LAB_00124fa4:
                pSVar17 = pSVar17 + 1;
                goto LAB_00124fcd;
              }
              iVar18 = *(int *)&pSVar17->pUserData;
              if ((iVar18 - 0xdU < 4) || (iVar18 == 2)) {
                if (pSVar17 + 1 < pGen->pEnd) {
                  iVar18 = 1;
                  do {
                    if ((pSVar17->nType & 0xa40) == 0) {
                      if ((pSVar17->nType & 0x1480) != 0) {
                        if (iVar18 < 2) break;
                        iVar18 = iVar18 + -1;
                      }
                    }
                    else {
                      iVar18 = iVar18 + 1;
                    }
                    pSVar17 = pSVar17 + 1;
                  } while (pSVar17 < pGen->pEnd);
                  pcVar10 = jx9CompileLangConstruct;
                  goto LAB_00124fc6;
                }
              }
              else if (iVar18 == 6) {
                pSVar20 = pSVar17 + 1;
                pSVar3 = pGen->pEnd;
                if (pSVar3 <= pSVar20) {
                  pcVar10 = jx9CompileLiteral;
                  goto LAB_0012509c;
                }
                sVar13 = pSVar17->nLine;
                pSVar11 = pSVar17 + 2;
                if ((pSVar17[1].nType & 0xc) == 0) {
                  pSVar11 = pSVar20;
                }
                if ((pSVar3 <= pSVar11) || ((pSVar11->nType & 0x200) == 0)) {
                  pcVar12 = "Missing opening parenthesis \'(\' while declaring annonymous function";
LAB_001254f4:
                  iVar18 = jx9GenCompileError(pGen,1,sVar13,pcVar12);
                  goto LAB_00125503;
                }
                pSVar11 = pSVar11 + 1;
                if (pSVar11 < pSVar3) {
                  iVar18 = 1;
                  do {
                    if ((pSVar11->nType >> 9 & 1) == 0) {
                      if ((pSVar11->nType >> 10 & 1) != 0) {
                        if (iVar18 < 2) break;
                        iVar18 = iVar18 + -1;
                      }
                    }
                    else {
                      iVar18 = iVar18 + 1;
                    }
                    pSVar11 = pSVar11 + 1;
                  } while (pSVar11 < pSVar3);
                }
                if ((pSVar3 <= pSVar11) || (pSVar20 = pSVar11 + 1, pSVar3 <= pSVar20)) {
                  pcVar12 = "Syntax error while declaring annonymous function";
                  goto LAB_001254f4;
                }
                if ((pSVar11[1].nType & 0x40) != 0) {
                  pSVar11 = pSVar11 + 2;
                  if (pSVar11 < pSVar3) {
                    iVar18 = 1;
                    do {
                      if ((pSVar11->nType & 0x40) == 0) {
                        if ((char)pSVar11->nType < '\0') {
                          if (iVar18 < 2) break;
                          iVar18 = iVar18 + -1;
                        }
                      }
                      else {
                        iVar18 = iVar18 + 1;
                      }
                      pSVar11 = pSVar11 + 1;
                    } while (pSVar11 < pSVar3);
                  }
                  pSVar20 = pSVar11 + (pSVar11 < pSVar3);
LAB_0012520e:
                  pcVar10 = jx9CompileAnnonFunc;
                  goto LAB_0012509c;
                }
                sVar7 = jx9GenCompileError(pGen,1,sVar13,
                                           "Syntax error while declaring annonymous function, missing \'{\'"
                                          );
                if (sVar7 != -10) goto LAB_0012520e;
                uVar14 = 0xfffffff6;
LAB_00125511:
                SyMemBackendPoolFree(&pGen->pVm->sAllocator,pChunk);
                goto LAB_00125574;
              }
LAB_001251b1:
              pSVar17 = pSVar17 + 1;
              pcVar10 = jx9CompileLiteral;
              goto LAB_00124fc6;
            }
            pSVar20 = pSVar17 + 1;
            pSVar3 = pGen->pEnd;
            if (pSVar20 < pSVar3) {
              iVar18 = 1;
              do {
                if ((pSVar20->nType >> 0xb & 1) == 0) {
                  if ((pSVar20->nType >> 0xc & 1) != 0) {
                    if (iVar18 < 2) break;
                    iVar18 = iVar18 + -1;
                  }
                }
                else {
                  iVar18 = iVar18 + 1;
                }
                pSVar20 = pSVar20 + 1;
              } while (pSVar20 < pSVar3);
            }
            if (pSVar3 <= pSVar20) {
              sVar13 = pSVar17->nLine;
              pcVar12 = "JSON Array: Missing closing square bracket \']\'";
              goto LAB_001254f4;
            }
            pSVar20 = pSVar20 + 1;
            pcVar10 = jx9CompileJsonArray;
          }
          else {
            pSVar20 = pSVar17 + 1;
            pSVar3 = pGen->pEnd;
            if (pSVar20 < pSVar3) {
              iVar18 = 1;
              do {
                if ((pSVar20->nType & 0x40) == 0) {
                  if ((char)pSVar20->nType < '\0') {
                    if (iVar18 < 2) break;
                    iVar18 = iVar18 + -1;
                  }
                }
                else {
                  iVar18 = iVar18 + 1;
                }
                pSVar20 = pSVar20 + 1;
              } while (pSVar20 < pSVar3);
            }
            if (pSVar3 <= pSVar20) {
              sVar13 = pSVar17->nLine;
              pcVar12 = "JSON Object: Missing closing braces \'}\'";
              goto LAB_001254f4;
            }
            pSVar20 = pSVar20 + 1;
            pcVar10 = jx9CompileJsonObject;
          }
LAB_0012509c:
          pChunk[6] = pcVar10;
          pSVar17 = pSVar20;
        }
        else {
          if (pGen->pEnd <= pSVar17 + 1) {
            sVar13 = pSVar17->nLine;
            pcVar12 = "Invalid variable name";
            goto LAB_001254f4;
          }
          pSVar17 = pSVar17 + 2;
          pcVar10 = jx9CompileVariable;
LAB_00124fc6:
          pChunk[6] = pcVar10;
        }
LAB_00124fcd:
        pChunk[4] = pSVar17;
        pGen->pIn = pSVar17;
        local_38 = pChunk;
        SySetPut(&local_68,&local_38);
        sVar13 = local_68.nUsed;
        apNode = (jx9_expr_node **)local_68.pBase;
      } while (pGen->pIn < pGen->pEnd);
      uVar22 = (ulong)local_68.nUsed;
      if (uVar22 == 0) {
        uVar14 = 0;
LAB_00125574:
        bVar6 = 0;
        uVar22 = (ulong)local_68.nUsed;
        apNode = (jx9_expr_node **)local_68.pBase;
      }
      else {
        if (0 < (int)local_68.nUsed) {
          pjVar4 = *local_68.pBase;
          if ((pjVar4->pOp != (jx9_expr_op *)0x0) && ((pjVar4->pOp->iOp & 0xfffffffeU) == 0x10)) {
            pjVar8 = jx9ExprExtractOperator(&pjVar4->pStart->sData,(SyToken *)0x0);
            pjVar4->pOp = pjVar8;
            (*apNode)->pStart->pUserData = (*apNode)->pOp;
          }
          uVar9 = 0;
          iVar18 = 0;
          iVar23 = 0;
          iVar19 = 0;
          do {
            pjVar4 = apNode[uVar9];
            pSVar17 = pjVar4->pStart;
            uVar14 = pSVar17->nType;
            if ((uVar14 >> 9 & 1) == 0) {
              if ((uVar14 >> 10 & 1) == 0) {
                if (((uVar14 >> 0xb & 1) == 0) || (pjVar4->xCode != (ProcNodeConstruct)0x0)) {
                  if ((uVar14 >> 0xc & 1) == 0) {
                    if (((uVar14 & 0x40) == 0) || (pjVar4->xCode != (ProcNodeConstruct)0x0)) {
                      if ((char)uVar14 < '\0') {
                        if (iVar18 < 1) {
                          pcVar12 = "Syntax error: Unexpected token \'}\'";
                          goto LAB_00125554;
                        }
                        iVar18 = iVar18 + -1;
                      }
                      else if ((((uVar9 != 0) && ((uVar14 & 0x20) != 0)) &&
                               (iVar1 = pjVar4->pOp->iOp, iVar1 - 7U < 2)) &&
                              (apNode[uVar9 - 1]->xCode == jx9CompileVariable ||
                               apNode[uVar9 - 1]->xCode == jx9CompileLiteral)) {
                        psVar15 = &aOpTable[0].iOp;
                        lVar16 = 0;
                        do {
                          if (*psVar15 == (iVar1 == 8 ^ 0x11)) goto LAB_0012539a;
                          lVar16 = lVar16 + 1;
                          psVar15 = psVar15 + 8;
                        } while (lVar16 != 0x32);
                        lVar16 = 0x32;
LAB_0012539a:
                        pjVar4->pOp = aOpTable + lVar16;
                        apNode[uVar9]->pStart->pUserData = aOpTable + lVar16;
                      }
                    }
                    else {
                      iVar18 = iVar18 + 1;
                    }
                  }
                  else {
                    if (iVar23 < 1) {
                      pcVar12 = "Syntax error: Unexpected token \']\'";
                      goto LAB_00125554;
                    }
                    iVar23 = iVar23 + -1;
                  }
                }
                else {
                  iVar23 = iVar23 + 1;
                }
              }
              else {
                if (iVar19 < 1) {
                  pcVar12 = "Syntax error: Unexpected token \')\'";
                  goto LAB_00125554;
                }
                iVar19 = iVar19 + -1;
              }
            }
            else {
              if (((uVar9 != 0) &&
                  (p_Var5 = apNode[uVar9 - 1]->xCode, uVar2 = apNode[uVar9 - 1]->pStart->nType,
                  (uVar2 & 0x740c) != 0 ||
                  (p_Var5 == jx9CompileLiteral || p_Var5 == jx9CompileVariable))) &&
                 ((uVar2 & 0x20) == 0)) {
                pSVar17->nType = uVar14 | 0x20;
                pSVar17->pUserData = &sFCallOp;
                apNode[uVar9]->pOp = &sFCallOp;
              }
              iVar19 = iVar19 + 1;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar22);
          if ((iVar19 != 0 || iVar23 != 0) || iVar18 != 0) {
            pSVar17 = (*apNode)->pStart;
            pcVar12 = "Syntax error, mismatched \'(\', \'[\' or \'{\'";
LAB_00125554:
            sVar7 = jx9GenCompileError(pGen,1,pSVar17->nLine,pcVar12);
            uVar14 = (uint)(sVar7 == -10) * 2 | 0xfffffff4;
            goto LAB_00125574;
          }
        }
        uVar14 = ExprMakeTree(pGen,apNode,sVar13);
        if (uVar14 != 0) goto LAB_00125574;
        pjVar4 = *apNode;
        if (pjVar4 == (jx9_expr_node *)0x0) {
          bVar6 = 0;
          uVar14 = 0;
        }
        else {
          if ((xTreeValidator == (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0) ||
             (sVar7 = (*xTreeValidator)(pGen,pjVar4), sVar7 != -10)) {
            uVar14 = GenStateEmitExprCode(pGen,pjVar4,iFlags);
          }
          else {
            uVar14 = 0xfffffff6;
          }
          bVar6 = 1;
        }
      }
      if ((int)uVar22 != 0) {
        uVar9 = 0;
        do {
          if (apNode[uVar9] != (jx9_expr_node *)0x0) {
            ExprFreeTree(pGen,apNode[uVar9]);
          }
          uVar9 = uVar9 + 1;
        } while (uVar22 != uVar9);
      }
      pGen->pEnd = local_40;
      pGen->pIn = pSVar24;
      pjVar21 = (jx9_vm *)local_68.pAllocator;
      if (uVar14 == 0xfffffff6) {
        if (apNode == (jx9_expr_node **)0x0 || (jx9_vm *)local_68.pAllocator == (jx9_vm *)0x0) {
          return -10;
        }
        SyMemBackendFree(local_68.pAllocator,apNode);
        return -10;
      }
      goto LAB_0012521d;
    }
  }
  bVar6 = 0;
LAB_0012521d:
  if (apNode != (jx9_expr_node **)0x0 && pjVar21 != (jx9_vm *)0x0) {
    SyMemBackendFree(&pjVar21->sAllocator,apNode);
  }
  return (uint)bVar6 * 3 + -3;
}

Assistant:

static sxi32 jx9CompileExpr(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags,        /* Control flags */
	sxi32 (*xTreeValidator)(jx9_gen_state *, jx9_expr_node *) /* Node validator callback.NULL otherwise */
	)
{
	jx9_expr_node *pRoot;
	SySet sExprNode;
	SyToken *pEnd;
	sxi32 nExpr;
	sxi32 iNest;
	sxi32 rc;
	/* Initialize worker variables */
	nExpr = 0;
	pRoot = 0;
	SySetInit(&sExprNode, &pGen->pVm->sAllocator, sizeof(jx9_expr_node *));
	SySetAlloc(&sExprNode, 0x10);
	rc = SXRET_OK;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	iNest = 0;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_OCB /* '{' */ ){
			/* Ticket 1433-30: Annonymous/Closure functions body */
			iNest++;
		}else if(pEnd->nType & JX9_TK_CCB /* '}' */ ){
			iNest--;
		}else if( pEnd->nType & JX9_TK_SEMI /* ';' */ ){
			if( iNest <= 0 ){
				break;
			}
		}
		pEnd++;
	}
	if( iFlags & EXPR_FLAG_COMMA_STATEMENT ){
		SyToken *pEnd2 = pGen->pIn;
		iNest = 0;
		/* Stop at the first comma */
		while( pEnd2 < pEnd ){
			if( pEnd2->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_LPAREN/*'('*/) ){
				iNest++;
			}else if(pEnd2->nType & (JX9_TK_CCB/*'}'*/|JX9_TK_CSB/*']'*/|JX9_TK_RPAREN/*')'*/)){
				iNest--;
			}else if( pEnd2->nType & JX9_TK_COMMA /*','*/ ){
				if( iNest <= 0 ){
					break;
				}
			}
			pEnd2++;
		}
		if( pEnd2 <pEnd ){
			pEnd = pEnd2;
		}
	}
	if( pEnd > pGen->pIn ){
		SyToken *pTmp = pGen->pEnd;
		/* Swap delimiter */
		pGen->pEnd = pEnd;
		/* Try to get an expression tree */
		rc = jx9ExprMakeTree(&(*pGen), &sExprNode, &pRoot);
		if( rc == SXRET_OK && pRoot ){
			rc = SXRET_OK;
			if( xTreeValidator ){
				/* Call the upper layer validator callback */
				rc = xTreeValidator(&(*pGen), pRoot);
			}
			if( rc != SXERR_ABORT ){
				/* Generate code for the given tree */
				rc = GenStateEmitExprCode(&(*pGen), pRoot, iFlags);
			}
			nExpr = 1;
		}
		/* Release the whole tree */
		jx9ExprFreeTree(&(*pGen), &sExprNode);
		/* Synchronize token stream */
		pGen->pEnd = pTmp;
		pGen->pIn  = pEnd;
		if( rc == SXERR_ABORT ){
			SySetRelease(&sExprNode);
			return SXERR_ABORT;
		}
	}
	SySetRelease(&sExprNode);
	return nExpr > 0 ? SXRET_OK : SXERR_EMPTY;
}